

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O2

pair<std::pair<sjtu::orderType,_long>_*,_long> __thiscall
sjtu::FileManager<std::pair<sjtu::orderType,_long>_>::newspace
          (FileManager<std::pair<sjtu::orderType,_long>_> *this)

{
  undefined1 *puVar1;
  pair<std::pair<sjtu::orderType,_long>_*,_long> pVar2;
  locType offset;
  pair<sjtu::orderType,_long> tmp;
  
  puVar1 = &(this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).field_0x18;
  std::ostream::seekp((long)puVar1,_S_beg);
  std::ios::clear((int)this + 8 +
                  (int)*(undefined8 *)
                        (*(long *)&(this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>)
                                   .file + -0x18));
  memset(&tmp,0,0xc0);
  offset = std::ostream::tellp();
  std::ostream::write(puVar1,(long)&tmp);
  pVar2.first = LRUCache<std::pair<sjtu::orderType,_long>_>::load
                          ((this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).cache,
                           &offset);
  pVar2.second = offset;
  return pVar2;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			file.seekp(0 , std::ios_base::end) , file.clear();
			T tmp;locType offset = file.tellp();
			file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
			return std::make_pair(cache -> load(offset) , offset);
		}